

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  bool bVar2;
  string *psVar3;
  reference e;
  pointer this_00;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  string local_360;
  undefined1 local_340 [8];
  string reg_shared;
  undefined1 local_300 [8];
  string reg_static;
  string reg_any;
  string *p;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_298 [8];
  string reg;
  string libext;
  string *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  cmList *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  iterator local_210;
  size_type local_208;
  undefined1 local_200 [8];
  cmList sharedSuffixList;
  string local_1e0;
  cmValue local_1c0;
  cmValue sharedSuffixes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  cmList linkSuffixList;
  string local_140;
  cmValue local_120;
  cmValue linkSuffixes;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_18 = pcVar1;
  mf = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_STATIC_LIBRARY_PREFIX",&local_39);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_38);
  AddLinkPrefix(this,psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_SHARED_LIBRARY_PREFIX",&local_71);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_70);
  AddLinkPrefix(this,psVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_99);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
  AddLinkExtension(this,psVar3,LinkShared);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_STATIC_LIBRARY_SUFFIX",&local_c1);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_c0);
  AddLinkExtension(this,psVar3,LinkStatic);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_SHARED_LIBRARY_SUFFIX",&local_e9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_e8);
  AddLinkExtension(this,psVar3,LinkShared);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"CMAKE_LINK_LIBRARY_SUFFIX",
             (allocator<char> *)((long)&linkSuffixes.Value + 7));
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
  AddLinkExtension(this,psVar3,LinkUnknown);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkSuffixes.Value + 7));
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CMAKE_EXTRA_LINK_EXTENSIONS",
             (allocator<char> *)
             ((long)&linkSuffixList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_120 = cmMakefile::GetDefinition(pcVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkSuffixList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_120);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_120);
    std::__cxx11::string::string((string *)&local_190,(string *)psVar3);
    local_170 = &local_190;
    local_168 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_170;
    cmList::cmList((cmList *)local_160,init_00);
    local_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
    do {
      local_420 = local_420 + -1;
      std::__cxx11::string::~string((string *)local_420);
    } while (local_420 != &local_190);
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_160);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)local_160);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      sharedSuffixes.Value =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      AddLinkExtension(this,sharedSuffixes.Value,LinkUnknown);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_160);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",
             (allocator<char> *)
             ((long)&sharedSuffixList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1c0 = cmMakefile::GetDefinition(pcVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sharedSuffixList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_1c0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_1c0);
    std::__cxx11::string::string((string *)&local_230,(string *)psVar3);
    local_210 = &local_230;
    local_208 = 1;
    init._M_len = 1;
    init._M_array = local_210;
    cmList::cmList((cmList *)local_200,init);
    local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210;
    do {
      local_480 = local_480 + -1;
      std::__cxx11::string::~string((string *)local_480);
    } while (local_480 != &local_230);
    __end2_1 = cmList::begin_abi_cxx11_((cmList *)local_200);
    i_1 = (string *)cmList::end_abi_cxx11_((cmList *)local_200);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&i_1), bVar2) {
      e = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_1);
      AddLinkExtension(this,e,LinkShared);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    cmList::~cmList((cmList *)local_200);
  }
  CreateExtensionRegex((string *)((long)&reg.field_2 + 8),this,&this->LinkExtensions,LinkUnknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_298,"(.*)",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::operator+=((string *)local_298,(string *)(reg.field_2._M_local_buf + 8));
  this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
            operator->(&this->OrderLinkerSearchPath);
  cmOrderDirectories::SetLinkExtensionInfo(this_00,&this->LinkExtensions,(string *)local_298);
  std::__cxx11::string::operator=((string *)local_298,"^(");
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->LinkPrefixes);
  p = (string *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->LinkPrefixes);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&p), bVar2) {
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)local_298,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)local_298,'|');
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)local_298,")([^/:]*)");
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
            ((string *)((long)&reg_static.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&reg.field_2 + 8));
  cmsys::RegularExpression::compile
            (&this->ExtractAnyLibraryName,(string *)((long)&reg_static.field_2 + 8));
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->StaticLinkExtensions);
  if (!bVar2) {
    CreateExtensionRegex
              ((string *)((long)&reg_shared.field_2 + 8),this,&this->StaticLinkExtensions,LinkStatic
              );
    cmStrCat<std::__cxx11::string&,std::__cxx11::string>
              ((string *)local_300,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&reg_shared.field_2 + 8));
    std::__cxx11::string::~string((string *)(reg_shared.field_2._M_local_buf + 8));
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,(string *)local_300);
    std::__cxx11::string::~string((string *)local_300);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->SharedLinkExtensions);
  if (!bVar2) {
    std::__cxx11::string::string((string *)local_340,(string *)local_298);
    CreateExtensionRegex(&local_360,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::operator+=((string *)local_340,(string *)&this->SharedRegexString);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::string::~string((string *)(reg_static.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)(reg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (cmValue linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    cmList linkSuffixList{ *linkSuffixes };
    for (auto const& i : linkSuffixList) {
      this->AddLinkExtension(i, LinkUnknown);
    }
  }
  if (cmValue sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    cmList sharedSuffixList{ *sharedSuffixes };
    for (std::string const& i : sharedSuffixList) {
      this->AddLinkExtension(i, LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::string const& p : this->LinkPrefixes) {
    reg += p;
    reg += '|';
  }
  reg += ")([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = cmStrCat(reg, libext);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any);

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = cmStrCat(
      reg, this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic));
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static);
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared);
  }
}